

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_lz4.c
# Opt level: O1

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  char cVar1;
  int iVar2;
  mode_t mVar3;
  wchar_t wVar4;
  archive *paVar5;
  time_t tVar6;
  time_t tVar7;
  char *pcVar8;
  la_int64_t v2;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  uchar *puVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  archive_entry *ae_1;
  archive_entry *ae;
  archive_entry *local_58;
  uint local_4c;
  archive *local_48;
  uchar *local_40;
  archive_entry *local_38;
  
  local_40 = sig;
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'\x96',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x97',0,"0",(long)iVar2,"archive_read_support_format_all(a)",paVar5);
  iVar2 = archive_read_support_filter_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x98',0,"0",(long)iVar2,"archive_read_support_filter_all(a)",paVar5);
  local_4c = (uint)siglen;
  if (local_4c != 0) {
    iVar2 = archive_read_set_option(paVar5,(char *)0x0,"rockridge",(char *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'\x9b',(uint)(iVar2 == 0),
                     "0 == archive_read_set_option(a, NULL, \"rockridge\", NULL)",paVar5);
  }
  if (1 < local_4c) {
    iVar2 = archive_read_set_option(paVar5,(char *)0x0,"joliet",(char *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'\x9e',(uint)(iVar2 == 0),
                     "0 == archive_read_set_option(a, NULL, \"joliet\", NULL)",paVar5);
  }
  iVar2 = archive_read_open_memory(paVar5,ctx,(size_t)local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x9f',0,"0",(long)iVar2,"archive_read_open_memory(a, buff, used)",paVar5);
  iVar2 = archive_read_next_header(paVar5,&local_38);
  local_48 = paVar5;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¥',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",paVar5);
  tVar6 = archive_entry_atime(local_38);
  tVar7 = archive_entry_ctime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¦',tVar6,"archive_entry_atime(ae)",tVar7,"archive_entry_ctime(ae)",
                      (void *)0x0);
  tVar6 = archive_entry_atime(local_38);
  tVar7 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'§',tVar6,"archive_entry_atime(ae)",tVar7,"archive_entry_mtime(ae)",
                      (void *)0x0);
  pcVar8 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
             ,L'¨',".","\".\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  paVar5 = local_48;
  uVar13 = local_4c;
  if (local_4c == 2) {
    wVar4 = L'±';
  }
  else {
    if (local_4c != 1) {
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'«',(uint)(mVar3 == 0x416d),"(S_IFDIR | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      goto LAB_001f3bfd;
    }
    wVar4 = L'®';
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,wVar4,(uint)(mVar3 == 0x41c0),"(S_IFDIR | 0700) == archive_entry_mode(ae)",
                   (void *)0x0);
  paVar5 = local_48;
LAB_001f3bfd:
  memset(*(void **)(tbs + 0x30),0,*(long *)(tbs + 0x20) << 3);
  tbs[0x28] = '\0';
  tbs[0x29] = '\0';
  tbs[0x2a] = '\0';
  tbs[0x2b] = '\0';
  if (*(long *)(tbs + 0x20) != 0) {
    puVar12 = (uchar *)0x0;
    do {
      local_40 = puVar12;
      iVar2 = archive_read_next_header(paVar5,&local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'N',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",paVar5);
      if (uVar13 == 0) {
        tVar6 = archive_entry_birthtime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'P',2,"2",tVar6,"archive_entry_birthtime(ae)",(void *)0x0);
        tVar6 = archive_entry_atime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'Q',3,"3",tVar6,"archive_entry_atime(ae)",(void *)0x0);
        tVar6 = archive_entry_ctime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'R',4,"4",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
      }
      else {
        wVar4 = archive_entry_birthtime_is_set(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'T',0,"0",(long)wVar4,"archive_entry_birthtime_is_set(ae)",(void *)0x0
                           );
        tVar6 = archive_entry_atime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'U',5,"5",tVar6,"archive_entry_atime(ae)",(void *)0x0);
        tVar6 = archive_entry_ctime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'V',5,"5",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
      }
      tVar6 = archive_entry_mtime(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'X',5,"5",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
      mVar3 = archive_entry_mode(local_58);
      if (uVar13 == 0) {
        bVar16 = mVar3 == 0x816d;
        wVar4 = L'Z';
        pcVar8 = "(S_IFREG | 0555) == archive_entry_mode(ae)";
      }
      else {
        bVar16 = mVar3 == 0x8100;
        wVar4 = L'\\';
        pcVar8 = "(S_IFREG | 0400) == archive_entry_mode(ae)";
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,wVar4,(uint)bVar16,pcVar8,(void *)0x0);
      v2 = archive_entry_size(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L']',0,"0",v2,"archive_entry_size(ae)",(void *)0x0);
      if (0 < *(int *)(tbs + 0x28)) {
        lVar14 = 0;
        do {
          pcVar8 = archive_entry_pathname(local_58);
          pcVar9 = archive_entry_symlink(local_58);
          if (pcVar9 != (char *)0x0) {
            sVar10 = strlen(pcVar9);
            wVar4 = L'\x01';
            if ((sVar10 != 1) && (sVar10 != 0x80)) {
              wVar4 = (wchar_t)(sVar10 == 0xff);
            }
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'j',wVar4,"length == 1 || length == 128 || length == 255",(void *)0x0
                            );
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                                ,L'k',(long)pcVar9[sVar10 - 1],"symlinkname[length-1]",0x78,"\'x\'",
                                (void *)0x0);
          }
          failure("Found duplicate for %s",pcVar8);
          iVar2 = strcmp(*(char **)(*(long *)(tbs + 0x30) + lVar14 * 8),pcVar8);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                           ,L'n',(uint)(iVar2 != 0),"strcmp(fns->names[i], pathname) != 0",
                           (void *)0x0);
          sVar10 = strlen(pcVar8);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                           ,L'o',(uint)(sVar10 <= *(ulong *)tbs),
                           "(length = strlen(pathname)) <= fns->maxlen",(void *)0x0);
          if (*(ulong *)(tbs + 8) < sVar10) {
            *(size_t *)(tbs + 8) = sVar10;
          }
          pcVar9 = strrchr(pcVar8,0x2e);
          if (pcVar9 != (char *)0x0) {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'u',(uint)((ulong)((long)pcVar9 - (long)pcVar8) <=
                                         *(ulong *)(tbs + 0x10)),
                             "(size_t)(p - pathname) <= fns->maxflen",(void *)0x0);
            sVar10 = strlen(pcVar9 + 1);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'w',(uint)(sVar10 <= *(ulong *)(tbs + 0x18)),
                             "strlen(p+1) <= fns->maxelen",(void *)0x0);
            if ((tbs[0x38] & 2) != 0) {
              pcVar11 = strchr(pcVar8,0x2e);
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                               ,L'z',(uint)(pcVar11 == pcVar9),"strchr(pathname, \'.\') == p",
                               (void *)0x0);
            }
          }
          cVar1 = *pcVar8;
          pcVar9 = pcVar8;
          while ((cVar1 != '\0' && (pcVar9 = pcVar9 + 1, (tbs[0x38] & 1) != 0))) {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'\x80',(uint)((byte)(cVar1 + 0x85U) < 0xe6),
                             "*p < \'a\' || *p > \'z\'",(void *)0x0);
            cVar1 = *pcVar9;
          }
          if ((tbs[0x38] & 4) == 0) {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'\x86',(uint)(*pcVar8 != '.'),"*pathname != \'.\'",(void *)0x0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)(tbs + 0x28));
      }
      pcVar8 = archive_entry_pathname(local_58);
      pcVar8 = strdup(pcVar8);
      iVar2 = *(int *)(tbs + 0x28);
      *(int *)(tbs + 0x28) = iVar2 + 1;
      *(char **)(*(long *)(tbs + 0x30) + (long)iVar2 * 8) = pcVar8;
      puVar12 = local_40 + 1;
      paVar5 = local_48;
      uVar13 = local_4c;
    } while (puVar12 < *(uchar **)(tbs + 0x20));
  }
  if (*(long *)(tbs + 0x20) != 0) {
    uVar15 = 0;
    do {
      free(*(void **)(*(long *)(tbs + 0x30) + uVar15 * 8));
      uVar15 = uVar15 + 1;
    } while (uVar15 < *(ulong *)(tbs + 0x20));
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¾',(long)*(int *)(tbs + 8),"(int)fns->longest_len",(long)*(int *)tbs,
                      "(int)fns->maxlen",(void *)0x0);
  iVar2 = archive_read_next_header(paVar5,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ã',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",paVar5);
  iVar2 = archive_read_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar5);
  iVar2 = archive_read_free(paVar5);
  wVar4 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                              ,L'Å',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",paVar5);
  return wVar4;
}

Assistant:

static void
verify(const char *name, const char *n[])
{
	struct archive_entry *ae;
	struct archive *a;
	int i,r;

	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_lz4(a);
	if (r == ARCHIVE_WARN) {
		skipping("lz4 reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, r);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	copy_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 200));

	/* Read entries, match up names with list above. */
	for (i = 0; n[i] != NULL; ++i) {
		failure("Could not read file %d (%s) from %s", i, n[i], name);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		if (r != ARCHIVE_OK) {
			archive_read_free(a);
			return;
		}
		assertEqualString(n[i], archive_entry_pathname(ae));
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZ4);
	assertEqualString(archive_filter_name(a, 0), "lz4");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}